

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O2

void sect_NewSection(char *name,SectionType type,uint32_t org,SectionSpec *attribs,
                    SectionModifier mod)

{
  SectionStackEntry *pSVar1;
  int iVar2;
  Section *pSVar3;
  SectionStackEntry **ppSVar4;
  
  if (currentLoadSection != (Section *)0x0) {
    fatalerror("Cannot change the section within a `LOAD` block\n");
  }
  ppSVar4 = &sectionStack;
  do {
    pSVar1 = *ppSVar4;
    if (pSVar1 == (SectionStackEntry *)0x0) {
      pSVar3 = getSection(name,type,org,attribs,mod);
      changeSection();
      curOffset = 0;
      if (mod != SECTION_UNION) {
        curOffset = pSVar3->size;
      }
      loadOffset = 0;
      currentSection = pSVar3;
      return;
    }
    if (pSVar1->section != (Section *)0x0) {
      iVar2 = strcmp(name,pSVar1->section->name);
      if (iVar2 == 0) {
        fatalerror("Section \'%s\' is already on the stack\n",name);
      }
    }
    ppSVar4 = &pSVar1->next;
  } while( true );
}

Assistant:

void sect_NewSection(char const *name, enum SectionType type, uint32_t org,
		     struct SectionSpec const *attribs, enum SectionModifier mod)
{
	if (currentLoadSection)
		fatalerror("Cannot change the section within a `LOAD` block\n");

	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(name, stack->section->name))
			fatalerror("Section '%s' is already on the stack\n", name);
	}

	struct Section *sect = getSection(name, type, org, attribs, mod);

	changeSection();
	curOffset = mod == SECTION_UNION ? 0 : sect->size;
	loadOffset = 0; // This is still used when checking for section size overflow!
	currentSection = sect;
}